

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall xmrig::String::String(String *this,char *str)

{
  void *pvVar1;
  char *in_RSI;
  undefined8 *in_RDI;
  size_t local_28;
  
  *in_RDI = 0;
  if (in_RSI == (char *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = strlen(in_RSI);
  }
  in_RDI[1] = local_28;
  if (in_RDI[1] != 0) {
    pvVar1 = operator_new__(in_RDI[1] + 1);
    *in_RDI = pvVar1;
    memcpy((void *)*in_RDI,in_RSI,in_RDI[1] + 1);
  }
  return;
}

Assistant:

xmrig::String::String(const char *str) :
    m_size(str == nullptr ? 0 : strlen(str))
{
    if (m_size == 0) {
        return;
    }

    m_data = new char[m_size + 1];
    memcpy(m_data, str, m_size + 1);
}